

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::OricMFMDSK::get_track_at_position(OricMFMDSK *this,Address address)

{
  _func_int *p_Var1;
  DiskImage DVar2;
  OricMFMDSK *pOVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  pthread_mutex_t *__mutex;
  long lVar7;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  shared_ptr<Storage::Disk::Track> sVar13;
  uint8_t last_header [6];
  byte local_b8 [8];
  FileHolder *local_b0;
  DiskImage local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  pthread_mutex_t *local_98;
  OricMFMDSK *local_90;
  PCMSegment local_88;
  
  local_88.length_of_a_bit.length = 1;
  local_88.length_of_a_bit.clock_rate = 1;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_b0 = (FileHolder *)((long)address + 8);
  __mutex = (pthread_mutex_t *)FileHolder::get_file_access_mutex(local_b0);
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  lVar7 = get_file_offset_for_position((OricMFMDSK *)address,in_RDX);
  local_98 = __mutex;
  FileHolder::seek(local_b0,lVar7,0);
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_90 = this;
  Encodings::MFM::GetMFMEncoder
            ((MFM *)&local_a8,&local_88.data,(vector<bool,_std::allocator<bool>_> *)0x0);
  bVar9 = false;
  uVar10 = 0;
  do {
    bVar4 = FileHolder::get8(local_b0);
    uVar11 = uVar10 + 1;
    p_Var1 = *local_a8._vptr_DiskImage;
    if (bVar4 == 0xa1) {
      bVar9 = true;
      (**(code **)(p_Var1 + 0x40))(local_a8._vptr_DiskImage,0x4489,0);
      uVar10 = uVar11;
    }
    else if (bVar4 == 0xc2) {
      (**(code **)(p_Var1 + 0x40))(local_a8._vptr_DiskImage,0x5224,0);
      uVar10 = uVar11;
    }
    else {
      (**(code **)(p_Var1 + 0x18))(local_a8._vptr_DiskImage,(ulong)(uint)bVar4,0);
      if (bVar9) {
        if (bVar4 == 0xfb) {
          uVar6 = 0x80 << (local_b8[3] & 0x1f);
          if (-1 < (int)uVar6) {
            uVar11 = (ulong)uVar6 + 3 + uVar10;
            lVar12 = 0x18fe - uVar10;
            lVar7 = 0;
            do {
              DVar2._vptr_DiskImage = local_a8._vptr_DiskImage;
              bVar4 = FileHolder::get8(local_b0);
              (**(code **)(*DVar2._vptr_DiskImage + 0x18))(DVar2._vptr_DiskImage,(ulong)bVar4,0);
              if (lVar12 == lVar7) goto LAB_00436986;
              lVar7 = lVar7 + 1;
              bVar9 = false;
              uVar10 = uVar11;
            } while (uVar6 + 2 != (int)lVar7);
            goto LAB_00436976;
          }
        }
        else if (bVar4 == 0xfe) {
          lVar7 = 0x1868 - uVar10;
          uVar10 = uVar10 + 7;
          lVar12 = 0;
          do {
            bVar4 = FileHolder::get8(local_b0);
            local_b8[lVar12] = bVar4;
            (**(code **)(*local_a8._vptr_DiskImage + 0x18))(local_a8._vptr_DiskImage,(ulong)bVar4,0)
            ;
            if (lVar7 == lVar12) goto LAB_00436986;
            lVar12 = lVar12 + 1;
            bVar9 = false;
          } while (lVar12 != 6);
          goto LAB_00436976;
        }
      }
      bVar9 = false;
      uVar10 = uVar11;
    }
LAB_00436976:
    if (0x1869 < uVar10) {
LAB_00436986:
      if (local_a8._vptr_DiskImage != (_func_int **)0x0) {
        (**(code **)(*local_a8._vptr_DiskImage + 8))();
      }
      pthread_mutex_unlock(local_98);
      local_a8._vptr_DiskImage = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment&>
                (&_Stack_a0,(PCMTrack **)&local_a8,(allocator<Storage::Disk::PCMTrack> *)local_b8,
                 &local_88);
      pOVar3 = local_90;
      (local_90->super_DiskImage)._vptr_DiskImage = local_a8._vptr_DiskImage;
      (local_90->file_).file_ = (FILE *)_Stack_a0._M_pi;
      _Var8._M_pi = extraout_RDX;
      if (local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        _Var8._M_pi = extraout_RDX_00;
      }
      if (local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        _Var8._M_pi = extraout_RDX_01;
      }
      sVar13.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var8._M_pi;
      sVar13.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pOVar3;
      return (shared_ptr<Storage::Disk::Track>)
             sVar13.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

std::shared_ptr<Track> OricMFMDSK::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(get_file_offset_for_position(address), SEEK_SET);

		// The file format omits clock bits. So it's not a genuine MFM capture.
		// A consumer must contextually guess when an FB, FC, etc is meant to be a control mark.
		std::size_t track_offset = 0;
		uint8_t last_header[6] = {0, 0, 0, 0, 0, 0};
		std::unique_ptr<Encodings::MFM::Encoder> encoder = Encodings::MFM::GetMFMEncoder(segment.data);
		bool did_sync = false;
		while(track_offset < 6250) {
			uint8_t next_byte = file_.get8();
			track_offset++;

			switch(next_byte) {
				default: {
					encoder->add_byte(next_byte);
					if(did_sync) {
						switch(next_byte) {
							default: break;

							case 0xfe:
								for(int byte = 0; byte < 6; byte++) {
									last_header[byte] = file_.get8();
									encoder->add_byte(last_header[byte]);
									++track_offset;
									if(track_offset == 6250) break;
								}
							break;

							case 0xfb:
								for(int byte = 0; byte < (128 << last_header[3]) + 2; byte++) {
									encoder->add_byte(file_.get8());
									++track_offset;
									// Special exception: don't interrupt a sector body if it seems to
									// be about to run over the end of the track. It seems like BD-500
									// disks break the usual 6250-byte rule, pushing out to just less
									// than 6400 bytes total.
									if(track_offset == 6400) break;
								}
							break;
						}
					}

					did_sync = false;
				}
				break;

				case 0xa1:	// a synchronisation mark that implies a sector or header coming
					encoder->output_short(Storage::Encodings::MFM::MFMSync);
					did_sync = true;
				break;

				case 0xc2:	// an 'ordinary' synchronisation mark
					encoder->output_short(Storage::Encodings::MFM::MFMIndexSync);
				break;
			}
		}
	}

	return std::make_shared<PCMTrack>(segment);
}